

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall
kj::MainBuilder::MainImpl::operator()
          (MainImpl *this,StringPtr programName,ArrayPtr<const_kj::StringPtr> params)

{
  Option *pOVar1;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *pFVar2;
  ProcessContext *pPVar3;
  StringPtr programName_00;
  StringPtr programName_01;
  StringPtr programName_02;
  StringPtr programName_03;
  StringPtr programName_04;
  StringPtr programName_05;
  StringPtr programName_06;
  StringPtr programName_07;
  StringPtr programName_08;
  StringPtr programName_09;
  StringPtr programName_10;
  StringPtr programName_11;
  StringPtr programName_12;
  StringPtr programName_13;
  StringPtr programName_14;
  StringPtr programName_15;
  StringPtr programName_16;
  StringPtr programName_17;
  StringPtr programName_18;
  StringPtr programName_19;
  StringPtr params_00;
  StringPtr params_01;
  Vector<kj::MainBuilder::Impl::Arg> *pVVar4;
  bool bVar5;
  uint uVar7;
  size_t sVar8;
  StringPtr *pSVar9;
  StringPtr *end;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar10;
  bool bVar6;
  pointer ppVar11;
  ulong uVar12;
  pointer ppVar13;
  NullableValue<kj::String> *pNVar14;
  String *pSVar15;
  String *pSVar16;
  ArrayPtr<const_char> *pAVar17;
  Impl *pIVar18;
  size_t sVar19;
  char (*pacVar20) [18];
  char (*pacVar21) [18];
  kj *this_00;
  Vector<kj::MainBuilder::Impl::Arg> *pVVar22;
  Vector<kj::MainBuilder::Impl::Arg> *params_1;
  String *in_R9;
  StringPtr SVar23;
  ArrayPtr<const_char> AVar24;
  String *in_stack_ffffffffffffef88;
  String *in_stack_ffffffffffffef90;
  bool local_f2a;
  bool local_f19;
  ArrayPtr<const_char> local_be8;
  char *local_bd8;
  size_t sStack_bd0;
  Validity local_bc8;
  Maybe<kj::String> local_ba8;
  undefined1 local_b88 [8];
  NullableValue<kj::String> error_8;
  Function<kj::MainBuilder::Validity_()> *f;
  ArrayPtr<const_char> local_b48;
  char *local_b38;
  size_t sStack_b30;
  String local_b20;
  ArrayPtr<const_char> local_b08;
  char *local_af8;
  size_t sStack_af0;
  Arg *local_ae8;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRStack_ae0;
  Validity local_ad0;
  Maybe<kj::String> local_ab0;
  undefined1 local_a90 [8];
  NullableValue<kj::String> error_7;
  ArrayPtr<const_char> local_a58;
  char *local_a48;
  size_t sStack_a40;
  Arg *local_a38;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRStack_a30;
  Validity local_a20;
  Maybe<kj::String> local_a00;
  undefined1 local_9e0 [8];
  NullableValue<kj::String> error_6;
  ArrayPtr<const_char> local_9a8;
  char *local_998;
  size_t sStack_990;
  uint local_97c;
  Arg *pAStack_978;
  uint i_1;
  Arg *argSpec_1;
  Arg *__end1_1;
  Arg *__begin1_1;
  Vector<kj::MainBuilder::Impl::Arg> *__range1_1;
  StringPtr *argPos;
  Arg *argSpec;
  Arg *__end1;
  Arg *__begin1;
  Vector<kj::MainBuilder::Impl::Arg> *__range1;
  undefined1 auStack_928 [4];
  uint requiredArgCount;
  char *local_918;
  size_t sStack_910;
  String local_900;
  ArrayPtr<const_char> local_8e8;
  char *local_8d8;
  size_t sStack_8d0;
  size_t local_8c8;
  size_t sStack_8c0;
  String local_8b0;
  ArrayPtr<const_char> local_898;
  char *local_888;
  size_t sStack_880;
  StringPtr local_870;
  StringPtr local_860;
  StringPtr local_850;
  StringPtr local_840;
  StringPtr local_830;
  StringPtr local_820;
  StringPtr local_810;
  uint local_800;
  uint local_7fc;
  uint j_1;
  uint count;
  ArrayPtr<kj::StringPtr> local_7e8;
  ArrayPtr<const_kj::StringPtr> local_7d8;
  undefined1 local_7c1 [25];
  ArrayPtr<const_char> local_7a8;
  undefined1 local_798 [8];
  StringPtr dummyArg;
  MainFunc subMain_1;
  StringPtr local_768;
  undefined4 local_754;
  ArrayPtr<const_kj::StringPtr> local_750;
  undefined1 local_739 [25];
  ArrayPtr<const_char> local_720;
  undefined1 local_710 [8];
  MainFunc subMain;
  _Self local_6f8;
  iterator iter_2;
  ArrayPtr<const_char> local_6d8;
  char *local_6c8;
  size_t sStack_6c0;
  Validity local_6b0;
  Maybe<kj::String> local_690;
  undefined1 local_670 [8];
  NullableValue<kj::String> error_5;
  ArrayPtr<const_char> local_638;
  char *local_628;
  size_t sStack_620;
  String local_610;
  ArrayPtr<const_char> local_5f8;
  char *local_5e8;
  size_t sStack_5e0;
  char *local_5d8;
  size_t sStack_5d0;
  Validity local_5c0;
  Maybe<kj::String> local_5a0;
  undefined1 local_580 [8];
  NullableValue<kj::String> error_4;
  String local_550;
  ArrayPtr<const_char> local_538;
  char *local_528;
  size_t sStack_520;
  ArrayPtr<const_char> local_518;
  Validity local_508;
  Maybe<kj::String> local_4e8;
  undefined1 local_4c8 [8];
  NullableValue<kj::String> error_3;
  StringPtr arg_1;
  Option *option_1;
  ArrayPtr<const_char> local_478;
  char *local_468;
  size_t sStack_460;
  _Self local_458;
  _Self local_450;
  iterator iter_1;
  undefined1 local_440 [3];
  char c;
  uint j;
  String local_430;
  ArrayPtr<const_char> local_418;
  char *local_408;
  size_t sStack_400;
  String local_3f0;
  ArrayPtr<const_char> local_3d8;
  char *local_3c8;
  size_t sStack_3c0;
  Validity local_3b0;
  Maybe<kj::String> local_390;
  undefined1 local_370 [8];
  NullableValue<kj::String> error_2;
  ArrayPtr<const_char> local_338;
  char *local_328;
  size_t sStack_320;
  String local_310;
  ArrayPtr<const_char> local_2f8;
  char *local_2e8;
  size_t sStack_2e0;
  char *local_2d8;
  size_t sStack_2d0;
  Validity local_2c0;
  Maybe<kj::String> local_2a0;
  undefined1 local_280 [8];
  NullableValue<kj::String> error_1;
  String local_250;
  ArrayPtr<const_char> local_238;
  char *local_228;
  size_t sStack_220;
  char *local_218;
  size_t sStack_210;
  Validity local_200;
  Maybe<kj::String> local_1e0;
  undefined1 local_1c0 [8];
  NullableValue<kj::String> error;
  StringPtr *arg;
  Option *option;
  ArrayPtr<const_char> local_178;
  char *local_168;
  size_t sStack_160;
  size_t local_158;
  size_t sStack_150;
  StringPtr local_140;
  _Self local_130;
  _Self local_128;
  iterator iter;
  ArrayPtr<const_char> local_100;
  ArrayPtr<const_char> local_f0;
  StringPtr local_e0;
  undefined1 local_d0 [8];
  NullableValue<unsigned_long> pos;
  Maybe<kj::StringPtr> maybeArg;
  ArrayPtr<const_char> name;
  StringPtr local_88;
  undefined1 auStack_78 [8];
  StringPtr param;
  size_t local_58;
  size_t i;
  Vector<kj::StringPtr> arguments;
  MainImpl *this_local;
  ArrayPtr<const_kj::StringPtr> params_local;
  StringPtr programName_local;
  
  pSVar16 = (String *)params.size_;
  this_local = (MainImpl *)params.ptr;
  sVar19 = programName.content.size_;
  params_local.size_ = (size_t)programName.content.ptr;
  arguments.builder.disposer = (ArrayDisposer *)this;
  params_local.ptr = (StringPtr *)pSVar16;
  Vector<kj::StringPtr>::Vector((Vector<kj::StringPtr> *)&i);
  local_58 = 0;
  do {
    sVar8 = ArrayPtr<const_kj::StringPtr>::size((ArrayPtr<const_kj::StringPtr> *)&this_local);
    if (sVar8 <= local_58) {
LAB_005d226b:
      pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
      bVar5 = std::
              map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
              ::empty(&pIVar18->subCommands);
      if (!bVar5) {
        local_918 = (char *)params_local.size_;
        sStack_910 = sVar19;
        StringPtr::StringPtr((StringPtr *)auStack_928,"missing command");
        SVar23.content.size_ = sStack_910;
        SVar23.content.ptr = local_918;
        usageError(this,SVar23,(StringPtr)_auStack_928);
      }
      __range1._4_4_ = 0;
      pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
      __begin1 = (Arg *)&pIVar18->args;
      __end1 = Vector<kj::MainBuilder::Impl::Arg>::begin
                         ((Vector<kj::MainBuilder::Impl::Arg> *)__begin1);
      argSpec = Vector<kj::MainBuilder::Impl::Arg>::end
                          ((Vector<kj::MainBuilder::Impl::Arg> *)__begin1);
      for (; __end1 != argSpec; __end1 = __end1 + 1) {
        argPos = &__end1->title;
        __range1._4_4_ = __end1->minCount + __range1._4_4_;
      }
      __range1_1 = (Vector<kj::MainBuilder::Impl::Arg> *)
                   Vector<kj::StringPtr>::begin((Vector<kj::StringPtr> *)&i);
      pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
      __begin1_1 = (Arg *)&pIVar18->args;
      __end1_1 = Vector<kj::MainBuilder::Impl::Arg>::begin
                           ((Vector<kj::MainBuilder::Impl::Arg> *)__begin1_1);
      argSpec_1 = Vector<kj::MainBuilder::Impl::Arg>::end
                            ((Vector<kj::MainBuilder::Impl::Arg> *)__begin1_1);
      for (; pVVar4 = __range1_1, __end1_1 != argSpec_1; __end1_1 = __end1_1 + 1) {
        pAStack_978 = __end1_1;
        for (local_97c = 0; pVVar4 = __range1_1, local_97c < pAStack_978->minCount;
            local_97c = local_97c + 1) {
          pVVar22 = (Vector<kj::MainBuilder::Impl::Arg> *)
                    Vector<kj::StringPtr>::end((Vector<kj::StringPtr> *)&i);
          if (pVVar4 == pVVar22) {
            local_998 = (char *)params_local.size_;
            sStack_990 = sVar19;
            str<char_const(&)[18],kj::StringPtr&>
                      ((String *)&error_6.field_1.value.content.disposer,(kj *)"missing argument ",
                       (char (*) [18])pAStack_978,(StringPtr *)pVVar22);
            StringPtr::StringPtr
                      ((StringPtr *)&local_9a8,(String *)&error_6.field_1.value.content.disposer);
            programName_04.content.size_ = sStack_990;
            programName_04.content.ptr = local_998;
            usageError(this,programName_04,(StringPtr)local_9a8);
          }
          local_a38 = (__range1_1->builder).ptr;
          pRStack_a30 = (__range1_1->builder).pos;
          params_00.content.ptr = (char *)(__range1_1->builder).ptr;
          params_00.content.size_ = (size_t)(__range1_1->builder).pos;
          Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                    (&local_a20,&pAStack_978->callback,params_00);
          Validity::releaseError(&local_a00,&local_a20);
          pNVar14 = _::readMaybe<kj::String>(&local_a00);
          _::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_9e0,pNVar14);
          Maybe<kj::String>::~Maybe(&local_a00);
          Validity::~Validity(&local_a20);
          pSVar15 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_9e0);
          pVVar4 = __range1_1;
          if (pSVar15 != (String *)0x0) {
            local_a48 = (char *)params_local.size_;
            sStack_a40 = sVar19;
            pSVar15 = _::NullableValue<kj::String>::operator*
                                ((NullableValue<kj::String> *)local_9e0);
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)&error_7.field_1.value.content.disposer,(kj *)pVVar4,
                       (StringPtr *)0x679aee,(char (*) [3])pSVar15,pSVar16);
            StringPtr::StringPtr
                      ((StringPtr *)&local_a58,(String *)&error_7.field_1.value.content.disposer);
            programName_03.content.size_ = sStack_a40;
            programName_03.content.ptr = local_a48;
            usageError(this,programName_03,(StringPtr)local_a58);
          }
          _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_9e0);
          __range1_1 = (Vector<kj::MainBuilder::Impl::Arg> *)&(__range1_1->builder).endPtr;
          __range1._4_4_ = __range1._4_4_ - 1;
        }
        while( true ) {
          bVar5 = false;
          if (local_97c < pAStack_978->maxCount) {
            pSVar9 = Vector<kj::StringPtr>::end((Vector<kj::StringPtr> *)&i);
            bVar5 = (long)(ulong)__range1._4_4_ < (long)pSVar9 - (long)__range1_1 >> 4;
          }
          if (!bVar5) break;
          local_ae8 = (__range1_1->builder).ptr;
          pRStack_ae0 = (__range1_1->builder).pos;
          params_01.content.ptr = (char *)(__range1_1->builder).ptr;
          params_01.content.size_ = (size_t)(__range1_1->builder).pos;
          Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                    (&local_ad0,&pAStack_978->callback,params_01);
          Validity::releaseError(&local_ab0,&local_ad0);
          pNVar14 = _::readMaybe<kj::String>(&local_ab0);
          _::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_a90,pNVar14);
          Maybe<kj::String>::~Maybe(&local_ab0);
          Validity::~Validity(&local_ad0);
          pSVar15 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_a90);
          pVVar4 = __range1_1;
          if (pSVar15 != (String *)0x0) {
            local_af8 = (char *)params_local.size_;
            sStack_af0 = sVar19;
            pSVar15 = _::NullableValue<kj::String>::operator*
                                ((NullableValue<kj::String> *)local_a90);
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      (&local_b20,(kj *)pVVar4,(StringPtr *)0x679aee,(char (*) [3])pSVar15,pSVar16);
            StringPtr::StringPtr((StringPtr *)&local_b08,&local_b20);
            programName_02.content.size_ = sStack_af0;
            programName_02.content.ptr = local_af8;
            usageError(this,programName_02,(StringPtr)local_b08);
          }
          _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_a90);
          __range1_1 = (Vector<kj::MainBuilder::Impl::Arg> *)&(__range1_1->builder).endPtr;
          local_97c = local_97c + 1;
        }
      }
      params_1 = (Vector<kj::MainBuilder::Impl::Arg> *)
                 Vector<kj::StringPtr>::end((Vector<kj::StringPtr> *)&i);
      pVVar22 = __range1_1;
      if (pVVar4 < params_1) {
        local_b38 = (char *)params_local.size_;
        __range1_1 = (Vector<kj::MainBuilder::Impl::Arg> *)&(__range1_1->builder).endPtr;
        sStack_b30 = sVar19;
        str<kj::StringPtr&,char_const(&)[21]>
                  ((String *)&f,(kj *)pVVar22,(StringPtr *)": too many arguments",
                   (char (*) [21])params_1);
        StringPtr::StringPtr((StringPtr *)&local_b48,(String *)&f);
        programName_01.content.size_ = sStack_b30;
        programName_01.content.ptr = local_b38;
        usageError(this,programName_01,(StringPtr)local_b48);
      }
      pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
      error_8.field_1.value.content.disposer =
           (ArrayDisposer *)
           _::readMaybe<kj::Function<kj::MainBuilder::Validity()>>(&pIVar18->finalCallback);
      if ((Function<kj::MainBuilder::Validity_()> *)error_8.field_1.value.content.disposer !=
          (Function<kj::MainBuilder::Validity_()> *)0x0) {
        Function<kj::MainBuilder::Validity_()>::operator()
                  (&local_bc8,
                   (Function<kj::MainBuilder::Validity_()> *)error_8.field_1.value.content.disposer)
        ;
        Validity::releaseError(&local_ba8,&local_bc8);
        pNVar14 = _::readMaybe<kj::String>(&local_ba8);
        _::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_b88,pNVar14);
        Maybe<kj::String>::~Maybe(&local_ba8);
        Validity::~Validity(&local_bc8);
        pSVar16 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_b88);
        if (pSVar16 != (String *)0x0) {
          local_bd8 = (char *)params_local.size_;
          sStack_bd0 = sVar19;
          pSVar16 = _::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_b88);
          StringPtr::StringPtr((StringPtr *)&local_be8,pSVar16);
          programName_00.content.size_ = sStack_bd0;
          programName_00.content.ptr = local_bd8;
          usageError(this,programName_00,(StringPtr)local_be8);
        }
        _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_b88);
      }
      local_754 = 0;
LAB_005d2bf7:
      Vector<kj::StringPtr>::~Vector((Vector<kj::StringPtr> *)&i);
      return;
    }
    pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                       ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58);
    auStack_78 = (undefined1  [8])(pSVar9->content).ptr;
    param.content.ptr = (char *)(pSVar9->content).size_;
    StringPtr::StringPtr(&local_88,"--");
    bVar5 = StringPtr::operator==((StringPtr *)auStack_78,&local_88);
    if (bVar5) {
      pSVar9 = ArrayPtr<const_kj::StringPtr>::begin((ArrayPtr<const_kj::StringPtr> *)&this_local);
      end = ArrayPtr<const_kj::StringPtr>::end((ArrayPtr<const_kj::StringPtr> *)&this_local);
      Vector<kj::StringPtr>::addAll<kj::StringPtr_const*>
                ((Vector<kj::StringPtr> *)&i,pSVar9 + local_58 + 1,end);
      goto LAB_005d226b;
    }
    StringPtr::StringPtr((StringPtr *)&name.size_,"--");
    bVar5 = StringPtr::startsWith((StringPtr *)auStack_78,(StringPtr *)&name.size_);
    if (bVar5) {
      ArrayPtr<const_char>::ArrayPtr
                ((ArrayPtr<const_char> *)&maybeArg.ptr.field_1.value.content.size_);
      Maybe<kj::StringPtr>::Maybe((Maybe<kj::StringPtr> *)&pos.field_1);
      StringPtr::findFirst(&local_e0,(char)auStack_78);
      other = _::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_e0);
      _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_d0,other)
      ;
      Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_e0);
      puVar10 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_d0);
      if (puVar10 == (unsigned_long *)0x0) {
        SVar23 = StringPtr::slice((StringPtr *)auStack_78,2);
        iter._M_node = (_Base_ptr)SVar23.content.ptr;
        AVar24 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&iter);
      }
      else {
        puVar10 = _::NullableValue<unsigned_long>::operator*
                            ((NullableValue<unsigned_long> *)local_d0);
        AVar24 = StringPtr::slice((StringPtr *)auStack_78,2,*puVar10);
        name.ptr = (char *)AVar24.size_;
        maybeArg.ptr.field_1.value.content.size_ = (size_t)AVar24.ptr;
        local_f0 = AVar24;
        puVar10 = _::NullableValue<unsigned_long>::operator*
                            ((NullableValue<unsigned_long> *)local_d0);
        AVar24 = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)auStack_78,*puVar10 + 1);
        local_100 = AVar24;
        Maybe<kj::StringPtr>::operator=
                  ((Maybe<kj::StringPtr> *)&pos.field_1,(StringPtr *)&local_100);
        AVar24.size_ = (size_t)name.ptr;
        AVar24.ptr = (char *)maybeArg.ptr.field_1.value.content.size_;
      }
      name.ptr = (char *)AVar24.size_;
      maybeArg.ptr.field_1.value.content.size_ = (size_t)AVar24.ptr;
      _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_d0);
      pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
      local_128._M_node =
           (_Base_ptr)
           std::
           map<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
           ::find(&pIVar18->longOptions,(key_type *)&maybeArg.ptr.field_1.value.content.size_);
      pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
      local_130._M_node =
           (_Base_ptr)
           std::
           map<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
           ::end(&pIVar18->longOptions);
      bVar5 = std::operator==(&local_128,&local_130);
      if (bVar5) {
        StringPtr::StringPtr(&local_140,"--help");
        bVar5 = StringPtr::operator==((StringPtr *)auStack_78,&local_140);
        if (bVar5) {
          local_158 = params_local.size_;
          programName_19.content.size_ = sVar19;
          programName_19.content.ptr = (char *)params_local.size_;
          sStack_150 = sVar19;
          printHelp(this,programName_19);
        }
        local_168 = (char *)params_local.size_;
        sStack_160 = sVar19;
        str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[22]>
                  ((String *)&option,(kj *)"--",(char (*) [3])((long)&maybeArg.ptr.field_1 + 8),
                   (ArrayPtr<const_char> *)": unrecognized option",(char (*) [22])pSVar16);
        StringPtr::StringPtr((StringPtr *)&local_178,(String *)&option);
        programName_18.content.size_ = sStack_160;
        programName_18.content.ptr = local_168;
        usageError(this,programName_18,(StringPtr)local_178);
      }
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>
                ::operator->(&local_128);
      pOVar1 = ppVar11->second;
      if ((pOVar1->hasArg & 1U) == 0) {
        bVar5 = Maybe<kj::StringPtr>::operator==((Maybe<kj::StringPtr> *)&pos.field_1,(void *)0x0);
        if (!bVar5) {
          local_408 = (char *)params_local.size_;
          sStack_400 = sVar19;
          str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[37]>
                    (&local_430,(kj *)"--",(char (*) [3])((long)&maybeArg.ptr.field_1 + 8),
                     (ArrayPtr<const_char> *)": option does not accept an argument",
                     (char (*) [37])pSVar16);
          StringPtr::StringPtr((StringPtr *)&local_418,&local_430);
          programName_13.content.size_ = sStack_400;
          programName_13.content.ptr = local_408;
          usageError(this,programName_13,(StringPtr)local_418);
        }
        Function<kj::MainBuilder::Validity_()>::operator()(&local_3b0,(pOVar1->field_2).func);
        Validity::releaseError(&local_390,&local_3b0);
        pNVar14 = _::readMaybe<kj::String>(&local_390);
        _::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_370,pNVar14);
        Maybe<kj::String>::~Maybe(&local_390);
        Validity::~Validity(&local_3b0);
        pSVar15 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_370);
        if (pSVar15 != (String *)0x0) {
          local_3c8 = (char *)params_local.size_;
          sStack_3c0 = sVar19;
          pSVar15 = _::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_370);
          str<kj::StringPtr&,char_const(&)[3],kj::String&>
                    (&local_3f0,(kj *)auStack_78,(StringPtr *)0x679aee,(char (*) [3])pSVar15,pSVar16
                    );
          StringPtr::StringPtr((StringPtr *)&local_3d8,&local_3f0);
          programName_14.content.size_ = sStack_3c0;
          programName_14.content.ptr = local_3c8;
          usageError(this,programName_14,(StringPtr)local_3d8);
        }
        _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_370);
      }
      else {
        error.field_1.value.content.disposer =
             (ArrayDisposer *)_::readMaybe<kj::StringPtr>((Maybe<kj::StringPtr> *)&pos.field_1);
        if ((ArrayPtr<const_char> *)error.field_1.value.content.disposer ==
            (ArrayPtr<const_char> *)0x0) {
          sVar8 = ArrayPtr<const_kj::StringPtr>::size((ArrayPtr<const_kj::StringPtr> *)&this_local);
          bVar5 = false;
          if (local_58 + 1 < sVar8) {
            pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
            StringPtr::StringPtr((StringPtr *)&error_1.field_1.value.content.disposer,"-");
            bVar6 = StringPtr::startsWith
                              (pSVar9,(StringPtr *)&error_1.field_1.value.content.disposer);
            bVar5 = false;
            if (bVar6) {
              pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                 ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
              sVar8 = StringPtr::size(pSVar9);
              bVar5 = 1 < sVar8;
            }
            bVar5 = (bool)(bVar5 ^ 1);
          }
          if (!bVar5) {
            local_328 = (char *)params_local.size_;
            sStack_320 = sVar19;
            str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[19]>
                      ((String *)&error_2.field_1.value.content.disposer,(kj *)"--",
                       (char (*) [3])((long)&maybeArg.ptr.field_1 + 8),
                       (ArrayPtr<const_char> *)": missing argument",(char (*) [19])pSVar16);
            StringPtr::StringPtr
                      ((StringPtr *)&local_338,(String *)&error_2.field_1.value.content.disposer);
            programName_15.content.size_ = sStack_320;
            programName_15.content.ptr = local_328;
            usageError(this,programName_15,(StringPtr)local_338);
          }
          local_58 = local_58 + 1;
          pFVar2 = (pOVar1->field_2).funcWithArg;
          pAVar17 = &ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58)->content;
          local_2d8 = pAVar17->ptr;
          sStack_2d0 = pAVar17->size_;
          Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                    (&local_2c0,pFVar2,(StringPtr)*pAVar17);
          Validity::releaseError(&local_2a0,&local_2c0);
          pNVar14 = _::readMaybe<kj::String>(&local_2a0);
          _::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_280,pNVar14);
          Maybe<kj::String>::~Maybe(&local_2a0);
          Validity::~Validity(&local_2c0);
          pSVar15 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_280);
          if (pSVar15 != (String *)0x0) {
            local_2e8 = (char *)params_local.size_;
            sStack_2e0 = sVar19;
            pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58);
            pSVar16 = _::NullableValue<kj::String>::operator*
                                ((NullableValue<kj::String> *)local_280);
            str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                      (&local_310,(kj *)auStack_78,(StringPtr *)0x634085,(char (*) [2])pSVar9,
                       (StringPtr *)0x679aee,(char (*) [3])pSVar16,in_stack_ffffffffffffef88);
            StringPtr::StringPtr((StringPtr *)&local_2f8,&local_310);
            programName_16.content.size_ = sStack_2e0;
            programName_16.content.ptr = local_2e8;
            usageError(this,programName_16,(StringPtr)local_2f8);
          }
          _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_280);
        }
        else {
          local_218 = ((ArrayPtr<const_char> *)error.field_1.value.content.disposer)->ptr;
          sStack_210 = ((ArrayPtr<const_char> *)error.field_1.value.content.disposer)->size_;
          Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                    (&local_200,(pOVar1->field_2).funcWithArg,
                     (StringPtr)*(ArrayPtr<const_char> *)error.field_1.value.content.disposer);
          Validity::releaseError(&local_1e0,&local_200);
          pNVar14 = _::readMaybe<kj::String>(&local_1e0);
          _::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_1c0,pNVar14);
          Maybe<kj::String>::~Maybe(&local_1e0);
          Validity::~Validity(&local_200);
          pSVar15 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_1c0);
          if (pSVar15 != (String *)0x0) {
            local_228 = (char *)params_local.size_;
            sStack_220 = sVar19;
            pSVar15 = _::NullableValue<kj::String>::operator*
                                ((NullableValue<kj::String> *)local_1c0);
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      (&local_250,(kj *)auStack_78,(StringPtr *)0x679aee,(char (*) [3])pSVar15,
                       pSVar16);
            StringPtr::StringPtr((StringPtr *)&local_238,&local_250);
            programName_17.content.size_ = sStack_220;
            programName_17.content.ptr = local_228;
            usageError(this,programName_17,(StringPtr)local_238);
          }
          _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_1c0);
        }
      }
      Maybe<kj::StringPtr>::~Maybe((Maybe<kj::StringPtr> *)&pos.field_1);
    }
    else {
      StringPtr::StringPtr((StringPtr *)local_440,"-");
      bVar6 = StringPtr::startsWith((StringPtr *)auStack_78,(StringPtr *)local_440);
      pacVar20 = (char (*) [18])CONCAT71((int7)(sVar8 >> 8),bVar6);
      bVar5 = false;
      if (bVar6) {
        sVar8 = StringPtr::size((StringPtr *)auStack_78);
        bVar5 = 1 < sVar8;
      }
      if (bVar5) {
        iter_1._M_node._4_4_ = 1;
        while( true ) {
          uVar12 = (ulong)iter_1._M_node._4_4_;
          sVar8 = StringPtr::size((StringPtr *)auStack_78);
          if (sVar8 <= uVar12) break;
          iter_1._M_node._3_1_ =
               StringPtr::operator[]((StringPtr *)auStack_78,(ulong)iter_1._M_node._4_4_);
          pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
          local_450._M_node =
               (_Base_ptr)
               std::
               map<char,_kj::MainBuilder::Impl::Option_*,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
               ::find(&pIVar18->shortOptions,(key_type_conflict *)((long)&iter_1._M_node + 3));
          pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
          local_458._M_node =
               (_Base_ptr)
               std::
               map<char,_kj::MainBuilder::Impl::Option_*,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
               ::end(&pIVar18->shortOptions);
          bVar5 = std::operator==(&local_450,&local_458);
          if (bVar5) {
            local_468 = (char *)params_local.size_;
            sStack_460 = sVar19;
            str<char_const(&)[2],char&,char_const(&)[22]>
                      ((String *)&option_1,(kj *)0x67a908,(char (*) [2])((long)&iter_1._M_node + 3),
                       ": unrecognized option",(char (*) [22])pSVar16);
            StringPtr::StringPtr((StringPtr *)&local_478,(String *)&option_1);
            programName_12.content.size_ = sStack_460;
            programName_12.content.ptr = local_468;
            usageError(this,programName_12,(StringPtr)local_478);
          }
          ppVar13 = std::_Rb_tree_iterator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>
                    ::operator->(&local_450);
          pOVar1 = ppVar13->second;
          if ((pOVar1->hasArg & 1U) != 0) {
            uVar7 = iter_1._M_node._4_4_ + 1;
            sVar8 = StringPtr::size((StringPtr *)auStack_78);
            if (uVar7 < sVar8) {
              AVar24 = (ArrayPtr<const_char>)
                       StringPtr::slice((StringPtr *)auStack_78,(ulong)(iter_1._M_node._4_4_ + 1));
              error_3.field_1.value.content.disposer = (ArrayDisposer *)AVar24.ptr;
              local_518 = AVar24;
              Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                        (&local_508,(pOVar1->field_2).funcWithArg,(StringPtr)AVar24);
              Validity::releaseError(&local_4e8,&local_508);
              pNVar14 = _::readMaybe<kj::String>(&local_4e8);
              _::NullableValue<kj::String>::NullableValue
                        ((NullableValue<kj::String> *)local_4c8,pNVar14);
              Maybe<kj::String>::~Maybe(&local_4e8);
              Validity::~Validity(&local_508);
              pSVar15 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_4c8);
              if (pSVar15 != (String *)0x0) {
                local_528 = (char *)params_local.size_;
                sStack_520 = sVar19;
                pSVar16 = _::NullableValue<kj::String>::operator*
                                    ((NullableValue<kj::String> *)local_4c8);
                str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr&,char_const(&)[3],kj::String&>
                          (&local_550,(kj *)0x67a908,(char (*) [2])((long)&iter_1._M_node + 3)," ",
                           (char (*) [2])((long)&error_3.field_1 + 0x10),(StringPtr *)0x679aee,
                           (char (*) [3])pSVar16,in_stack_ffffffffffffef90);
                StringPtr::StringPtr((StringPtr *)&local_538,&local_550);
                programName_11.content.size_ = sStack_520;
                programName_11.content.ptr = local_528;
                usageError(this,programName_11,(StringPtr)local_538);
              }
              _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_4c8);
            }
            else {
              sVar8 = ArrayPtr<const_kj::StringPtr>::size
                                ((ArrayPtr<const_kj::StringPtr> *)&this_local);
              bVar5 = false;
              if (local_58 + 1 < sVar8) {
                pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                   ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
                StringPtr::StringPtr((StringPtr *)&error_4.field_1.value.content.disposer,"-");
                bVar6 = StringPtr::startsWith
                                  (pSVar9,(StringPtr *)&error_4.field_1.value.content.disposer);
                bVar5 = false;
                if (bVar6) {
                  pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                     ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
                  sVar8 = StringPtr::size(pSVar9);
                  bVar5 = 1 < sVar8;
                }
                bVar5 = (bool)(bVar5 ^ 1);
              }
              if (!bVar5) {
                local_628 = (char *)params_local.size_;
                sStack_620 = sVar19;
                str<char_const(&)[2],char&,char_const(&)[19]>
                          ((String *)&error_5.field_1.value.content.disposer,(kj *)0x67a908,
                           (char (*) [2])((long)&iter_1._M_node + 3),": missing argument",
                           (char (*) [19])pSVar16);
                StringPtr::StringPtr
                          ((StringPtr *)&local_638,(String *)&error_5.field_1.value.content.disposer
                          );
                programName_09.content.size_ = sStack_620;
                programName_09.content.ptr = local_628;
                usageError(this,programName_09,(StringPtr)local_638);
              }
              local_58 = local_58 + 1;
              pFVar2 = (pOVar1->field_2).funcWithArg;
              pAVar17 = &ArrayPtr<const_kj::StringPtr>::operator[]
                                   ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58)->content;
              local_5d8 = pAVar17->ptr;
              sStack_5d0 = pAVar17->size_;
              Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                        (&local_5c0,pFVar2,(StringPtr)*pAVar17);
              Validity::releaseError(&local_5a0,&local_5c0);
              pNVar14 = _::readMaybe<kj::String>(&local_5a0);
              _::NullableValue<kj::String>::NullableValue
                        ((NullableValue<kj::String> *)local_580,pNVar14);
              Maybe<kj::String>::~Maybe(&local_5a0);
              Validity::~Validity(&local_5c0);
              pSVar15 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_580);
              if (pSVar15 != (String *)0x0) {
                local_5e8 = (char *)params_local.size_;
                sStack_5e0 = sVar19;
                pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                   ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58);
                pSVar16 = _::NullableValue<kj::String>::operator*
                                    ((NullableValue<kj::String> *)local_580);
                str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                          (&local_610,(kj *)0x67a908,(char (*) [2])((long)&iter_1._M_node + 3)," ",
                           (char (*) [2])pSVar9,(StringPtr *)0x679aee,(char (*) [3])pSVar16,
                           in_stack_ffffffffffffef90);
                StringPtr::StringPtr((StringPtr *)&local_5f8,&local_610);
                programName_10.content.size_ = sStack_5e0;
                programName_10.content.ptr = local_5e8;
                usageError(this,programName_10,(StringPtr)local_5f8);
              }
              _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_580);
            }
            break;
          }
          Function<kj::MainBuilder::Validity_()>::operator()(&local_6b0,(pOVar1->field_2).func);
          Validity::releaseError(&local_690,&local_6b0);
          pNVar14 = _::readMaybe<kj::String>(&local_690);
          _::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_670,pNVar14);
          Maybe<kj::String>::~Maybe(&local_690);
          Validity::~Validity(&local_6b0);
          pSVar15 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_670);
          if (pSVar15 != (String *)0x0) {
            local_6c8 = (char *)params_local.size_;
            sStack_6c0 = sVar19;
            pSVar16 = _::NullableValue<kj::String>::operator*
                                ((NullableValue<kj::String> *)local_670);
            str<char_const(&)[2],char&,char_const(&)[3],kj::String&>
                      ((String *)&iter_2,(kj *)0x67a908,(char (*) [2])((long)&iter_1._M_node + 3),
                       ": ",(char (*) [3])pSVar16,in_R9);
            StringPtr::StringPtr((StringPtr *)&local_6d8,(String *)&iter_2);
            programName_08.content.size_ = sStack_6c0;
            programName_08.content.ptr = local_6c8;
            usageError(this,programName_08,(StringPtr)local_6d8);
          }
          _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_670);
          iter_1._M_node._4_4_ = iter_1._M_node._4_4_ + 1;
        }
      }
      else {
        pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
        bVar5 = std::
                map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                ::empty(&pIVar18->subCommands);
        if (!bVar5) {
          pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
          local_6f8._M_node =
               (_Base_ptr)
               std::
               map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
               ::find(&pIVar18->subCommands,(key_type *)auStack_78);
          pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
          subMain.impl.ptr =
               (Iface *)std::
                        map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                        ::end(&pIVar18->subCommands);
          bVar5 = std::operator!=(&local_6f8,(_Self *)&subMain.impl.ptr);
          if (bVar5) {
            std::
            _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>::
            operator->(&local_6f8);
            Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
            operator()((Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                        *)local_710);
            local_739[0] = 0x20;
            str<kj::StringPtr&,char,kj::StringPtr&>
                      ((String *)(local_739 + 1),(kj *)&params_local.size_,(StringPtr *)local_739,
                       auStack_78,(StringPtr *)pSVar16);
            StringPtr::StringPtr((StringPtr *)&local_720,(String *)(local_739 + 1));
            sVar19 = ArrayPtr<const_kj::StringPtr>::size
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local);
            local_750 = ArrayPtr<const_kj::StringPtr>::slice
                                  ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1,sVar19)
            ;
            Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::operator()
                      ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)
                       local_710,(StringPtr)local_720,local_750);
            String::~String((String *)(local_739 + 1));
            local_754 = 1;
            Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::~Function
                      ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)
                       local_710);
          }
          else {
            StringPtr::StringPtr(&local_768,"help");
            bVar5 = StringPtr::operator==((StringPtr *)auStack_78,&local_768);
            if (!bVar5) {
              local_8d8 = (char *)params_local.size_;
              sStack_8d0 = sVar19;
              str<kj::StringPtr&,char_const(&)[18]>
                        (&local_900,(kj *)auStack_78,(StringPtr *)": unknown command",pacVar20);
              StringPtr::StringPtr((StringPtr *)&local_8e8,&local_900);
              programName_05.content.size_ = sStack_8d0;
              programName_05.content.ptr = local_8d8;
              usageError(this,programName_05,(StringPtr)local_8e8);
            }
            pacVar20 = (char (*) [18])
                       ArrayPtr<const_kj::StringPtr>::size
                                 ((ArrayPtr<const_kj::StringPtr> *)&this_local);
            if (pacVar20 <= (char (*) [18])(local_58 + 1)) {
              local_8c8 = params_local.size_;
              programName_06.content.size_ = sVar19;
              programName_06.content.ptr = (char *)params_local.size_;
              sStack_8c0 = sVar19;
              printHelp(this,programName_06);
            }
            pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
            pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
            local_6f8._M_node =
                 (_Base_ptr)
                 std::
                 map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                 ::find(&pIVar18->subCommands,pSVar9);
            pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
            subMain_1.impl.ptr =
                 (Iface *)std::
                          map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                          ::end(&pIVar18->subCommands);
            bVar5 = std::operator!=(&local_6f8,(_Self *)&subMain_1.impl.ptr);
            if (!bVar5) {
              pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                 ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
              StringPtr::StringPtr((StringPtr *)&j_1,"help");
              bVar5 = StringPtr::operator==(pSVar9,(StringPtr *)&j_1);
              if (bVar5) {
                local_7fc = 0;
                local_800 = (int)local_58 + 2;
                while( true ) {
                  pacVar20 = (char (*) [18])(ulong)local_800;
                  pacVar21 = (char (*) [18])
                             ArrayPtr<const_kj::StringPtr>::size
                                       ((ArrayPtr<const_kj::StringPtr> *)&this_local);
                  local_f19 = false;
                  if (pacVar20 < pacVar21) {
                    pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                       ((ArrayPtr<const_kj::StringPtr> *)&this_local,
                                        (ulong)local_800);
                    StringPtr::StringPtr(&local_810,"help");
                    bVar5 = StringPtr::operator==(pSVar9,&local_810);
                    pacVar20 = (char (*) [18])CONCAT71((int7)((ulong)pacVar20 >> 8),bVar5);
                    local_f2a = true;
                    if (!bVar5) {
                      pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                         ((ArrayPtr<const_kj::StringPtr> *)&this_local,
                                          (ulong)local_800);
                      StringPtr::StringPtr(&local_820,"--help");
                      local_f2a = StringPtr::operator==(pSVar9,&local_820);
                    }
                    local_f19 = local_f2a;
                  }
                  if (local_f19 == false) break;
                  local_7fc = local_7fc + 1;
                  local_800 = local_800 + 1;
                }
                if (local_7fc == 0) {
                  pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
                  pPVar3 = pIVar18->context;
                  StringPtr::StringPtr(&local_830,"Help about help?  We must go deeper...");
                  (*pPVar3->_vptr_ProcessContext[5])
                            (pPVar3,local_830.content.ptr,local_830.content.size_);
LAB_005d1f89:
                  pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
                  pPVar3 = pIVar18->context;
                  StringPtr::StringPtr
                            (&local_840,
                             "Yo dawg, I heard you like help.  So I wrote you some help about how to use help so you can get help on help."
                            );
                  (*pPVar3->_vptr_ProcessContext[5])
                            (pPVar3,local_840.content.ptr,local_840.content.size_);
LAB_005d1fe4:
                  pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
                  pPVar3 = pIVar18->context;
                  StringPtr::StringPtr(&local_850,"Help, I\'m trapped in a help text factory!");
                  (*pPVar3->_vptr_ProcessContext[5])
                            (pPVar3,local_850.content.ptr,local_850.content.size_);
                }
                else {
                  if (local_7fc == 1) goto LAB_005d1f89;
                  if (local_7fc == 2) goto LAB_005d1fe4;
                }
                if (local_7fc < 10) {
                  pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
                  pPVar3 = pIVar18->context;
                  StringPtr::StringPtr(&local_860,"Killed by signal 911 (SIGHELP)");
                  (*pPVar3->_vptr_ProcessContext[4])
                            (pPVar3,local_860.content.ptr,local_860.content.size_);
                }
                pIVar18 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
                pPVar3 = pIVar18->context;
                StringPtr::StringPtr(&local_870,"How to keep an idiot busy...");
                (*pPVar3->_vptr_ProcessContext[5])
                          (pPVar3,local_870.content.ptr,local_870.content.size_);
              }
              local_888 = (char *)params_local.size_;
              sStack_880 = sVar19;
              this_00 = (kj *)ArrayPtr<const_kj::StringPtr>::operator[]
                                        ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
              str<kj::StringPtr_const&,char_const(&)[18]>
                        (&local_8b0,this_00,(StringPtr *)": unknown command",pacVar20);
              StringPtr::StringPtr((StringPtr *)&local_898,&local_8b0);
              programName_07.content.size_ = sStack_880;
              programName_07.content.ptr = local_888;
              usageError(this,programName_07,(StringPtr)local_898);
            }
            std::
            _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>::
            operator->(&local_6f8);
            Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
            operator()((Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                        *)&dummyArg.content.size_);
            StringPtr::StringPtr((StringPtr *)local_798,"--help");
            local_7c1[0] = 0x20;
            pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
            str<kj::StringPtr&,char,kj::StringPtr_const&>
                      ((String *)(local_7c1 + 1),(kj *)&params_local.size_,(StringPtr *)local_7c1,
                       (char *)pSVar9,(StringPtr *)pSVar16);
            StringPtr::StringPtr((StringPtr *)&local_7a8,(String *)(local_7c1 + 1));
            local_7e8 = arrayPtr<kj::StringPtr>((StringPtr *)local_798,1);
            local_7d8 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_7e8);
            Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::operator()
                      ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)
                       &dummyArg.content.size_,(StringPtr)local_7a8,local_7d8);
            String::~String((String *)(local_7c1 + 1));
            local_754 = 1;
            Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::~Function
                      ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)
                       &dummyArg.content.size_);
          }
          goto LAB_005d2bf7;
        }
        Vector<kj::StringPtr>::add<kj::StringPtr&>
                  ((Vector<kj::StringPtr> *)&i,(StringPtr *)auStack_78);
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::operator()(StringPtr programName, ArrayPtr<const StringPtr> params) {
  Vector<StringPtr> arguments;

  for (size_t i = 0; i < params.size(); i++) {
    StringPtr param = params[i];
    if (param == "--") {
      // "--" ends option parsing.
      arguments.addAll(params.begin() + i + 1, params.end());
      break;
    } else if (param.startsWith("--")) {
      // Long option.
      ArrayPtr<const char> name;
      Maybe<StringPtr> maybeArg;
      KJ_IF_MAYBE(pos, param.findFirst('=')) {
        name = param.slice(2, *pos);
        maybeArg = param.slice(*pos + 1);
      } else {
        name = param.slice(2);
      }
      auto iter = impl->longOptions.find(name);
      if (iter == impl->longOptions.end()) {
        if (param == "--help") {
          printHelp(programName);
        } else {
          usageError(programName, str("--", name, ": unrecognized option"));
        }
      } else {
        const Impl::Option& option = *iter->second;
        if (option.hasArg) {
          // Argument expected.
          KJ_IF_MAYBE(arg, maybeArg) {
            // "--foo=blah": "blah" is the argument.
            KJ_IF_MAYBE(error, (*option.funcWithArg)(*arg).releaseError()) {
              usageError(programName, str(param, ": ", *error));
            }
          } else if (i + 1 < params.size() &&
                     !(params[i + 1].startsWith("-") && params[i + 1].size() > 1)) {
            // "--foo blah": "blah" is the argument.
            ++i;
            KJ_IF_MAYBE(error, (*option.funcWithArg)(params[i]).releaseError()) {
              usageError(programName, str(param, "=", params[i], ": ", *error));
            }
          } else {
            usageError(programName, str("--", name, ": missing argument"));
          }
        } else {
          // No argument expected.
          if (maybeArg == nullptr) {
            KJ_IF_MAYBE(error, (*option.func)().releaseError()) {
              usageError(programName, str(param, ": ", *error));
            }
          } else {
            usageError(programName, str("--", name, ": option does not accept an argument"));
          }
        }
      }
    }